

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_fwd_alen(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  bool bVar4;
  int iVar5;
  AliasRet AVar6;
  TRef TVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ushort uVar11;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar11 = J->chain[0x4b];
  while (uVar9 = (uint)uVar11, uVar10 = (uint)uVar1, uVar1 < uVar9) {
    pIVar3 = (J->cur).ir;
    uVar8 = (ulong)*(ushort *)((long)pIVar3 + (ulong)pIVar3[uVar9].field_0.op1 * 8 + 2);
    if (*(char *)((long)pIVar3 + uVar8 * 8 + 5) == '\x1e') {
      uVar8 = (ulong)pIVar3[uVar8].field_0.op1;
    }
    uVar10 = uVar9;
    if ((*(byte *)((long)pIVar3 + uVar8 * 8 + 4) & 0x1f) == 0xe) break;
    uVar11 = *(ushort *)((long)pIVar3 + (ulong)uVar9 * 8 + 6);
  }
  uVar11 = J->chain[0x49];
  if (uVar10 < uVar11) {
    pIVar3 = (J->cur).ir;
    do {
      if (pIVar3[uVar11].field_0.op1 == uVar1) {
        iVar5 = fwd_aa_tab_clear(J,(uint)uVar11,(uint)uVar1);
        if (iVar5 != 0) {
          uVar10 = (uint)J->chain[0x4a];
          goto LAB_001261c6;
        }
        iVar5 = 5;
        goto LAB_00126264;
      }
      uVar11 = *(ushort *)((long)pIVar3 + (ulong)uVar11 * 8 + 6);
    } while (uVar10 < uVar11);
  }
  goto LAB_0012626e;
  while( true ) {
    uVar8 = (ulong)uVar10;
    if (uVar1 == pIVar3[pIVar3[pIVar3[uVar8].field_0.op1].field_0.op1].field_0.op1) {
      iVar5 = 8;
      if ((*(byte *)((long)pIVar3 + uVar8 * 8 + 4) & 0x1f) != 0) {
        uVar2 = *(ushort *)((long)pIVar3 + (ulong)pIVar3[uVar8].field_0.op1 * 8 + 2);
        uVar8 = (ulong)uVar2;
        if ((((*(char *)((long)pIVar3 + uVar8 * 8 + 5) == ')') &&
             (pIVar3[uVar8].field_0.op1 == uVar11)) &&
            (uVar8 = (ulong)*(ushort *)((long)pIVar3 + uVar8 * 8 + 2),
            *(char *)((long)pIVar3 + uVar8 * 8 + 5) == '\x17')) && (pIVar3[uVar8].field_1.op12 == 1)
           ) {
          (J->fold).ins.field_0.op2 = uVar2;
        }
      }
      bVar4 = false;
    }
    else {
      AVar6 = aa_table(J,(uint)uVar1,
                       (uint)pIVar3[pIVar3[pIVar3[uVar8].field_0.op1].field_0.op1].field_0.op1);
      iVar5 = 0;
      if (AVar6 == ALIAS_NO) {
        iVar5 = 8;
      }
      else {
        uVar10 = (uint)*(ushort *)((long)pIVar3 + uVar8 * 8 + 6);
      }
      bVar4 = AVar6 != ALIAS_NO;
    }
    if (!bVar4) break;
LAB_001261c6:
    if (uVar10 <= uVar11) {
      iVar5 = 1;
      break;
    }
  }
LAB_00126264:
  if ((iVar5 != 8) && (iVar5 != 5)) {
    return (TRef)uVar11;
  }
LAB_0012626e:
  TVar7 = lj_ir_emit(J);
  return TVar7;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_alen(jit_State *J)
{
  IRRef tab = fins->op1;  /* Table reference. */
  IRRef lim = tab;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting HSTORE with numeric key. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    IRIns *href = IR(store->op1);
    IRIns *key = IR(href->op2);
    if (irt_isnum(key->o == IR_KSLOT ? IR(key->op1)->t : key->t)) {
      lim = ref;  /* Conflicting store found, limits search for ALEN. */
      break;
    }
    ref = store->prev;
  }

  /* Try to find a matching ALEN. */
  ref = J->chain[IR_ALEN];
  while (ref > lim) {
    /* CSE for ALEN only depends on the table, not the hint. */
    if (IR(ref)->op1 == tab) {
      IRRef sref;

      /* Search for aliasing table.clear. */
      if (!fwd_aa_tab_clear(J, ref, tab))
	break;

      /* Search for hint-forwarding or conflicting store. */
      sref = J->chain[IR_ASTORE];
      while (sref > ref) {
	IRIns *store = IR(sref);
	IRIns *aref = IR(store->op1);
	IRIns *fref = IR(aref->op1);
	if (tab == fref->op1) {  /* ASTORE to the same table. */
	  /* Detect t[#t+1] = x idiom for push. */
	  IRIns *idx = IR(aref->op2);
	  if (!irt_isnil(store->t) &&
	      idx->o == IR_ADD && idx->op1 == ref &&
	      IR(idx->op2)->o == IR_KINT && IR(idx->op2)->i == 1) {
	    /* Note: this requires an extra PHI check in loop unroll. */
	    fins->op2 = aref->op2;  /* Set ALEN hint. */
	  }
	  goto doemit;  /* Conflicting store, possibly giving a hint. */
	} else if (aa_table(J, tab, fref->op1) == ALIAS_NO) {
	  goto doemit;  /* Conflicting store. */
	}
	sref = store->prev;
      }

      return ref;  /* Plain ALEN forwarding. */
    }
    ref = IR(ref)->prev;
  }
doemit:
  return EMITFOLD;
}